

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O2

bool __thiscall van_kampen::GroupElement::isOpposite(GroupElement *this,GroupElement *other)

{
  __type_conflict _Var1;
  
  _Var1 = std::operator==(&this->name,&other->name);
  return _Var1 && this->reversed != other->reversed;
}

Assistant:

bool GroupElement::isOpposite(const GroupElement &other)
{
    return name == other.name && reversed != other.reversed;
}